

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldAccessor::RemoveLast(MapFieldAccessor *this,Field *data)

{
  int iVar1;
  RepeatedPtrFieldBase *pRVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  pRVar2 = MapFieldBase::MutableRepeatedField((MapFieldBase *)data);
  iVar1 = pRVar2->current_size_;
  if (iVar1 < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x397);
    other = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
    iVar1 = pRVar2->current_size_;
  }
  pRVar2->current_size_ = iVar1 + -1;
  (**(code **)(*pRVar2->rep_->elements[(long)iVar1 + -1] + 0x20))();
  return;
}

Assistant:

void RemoveLast(Field* data) const override {
    MutableRepeatedField(data)->RemoveLast();
  }